

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::
FixContainingTypeInDescriptor<google::protobuf::Descriptor>
          (Generator *this,Descriptor *descriptor,Descriptor *containing_descriptor)

{
  Printer *this_00;
  string_view local_80 [2];
  undefined1 local_60 [8];
  string parent_name;
  string nested_name;
  Descriptor *containing_descriptor_local;
  Descriptor *descriptor_local;
  Generator *this_local;
  
  if (containing_descriptor != (Descriptor *)0x0) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              ((string *)((long)&parent_name.field_2 + 8),this,descriptor);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              ((string *)local_60,this,containing_descriptor);
    this_00 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_80,"$nested_name$.containing_type = $parent_name$\n");
    protobuf::io::Printer::Print<char[12],std::__cxx11::string,char[12],std::__cxx11::string>
              (this_00,local_80[0],(char (*) [12])"nested_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&parent_name.field_2 + 8),(char (*) [12])"parent_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(parent_name.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void Generator::FixContainingTypeInDescriptor(
    const DescriptorT& descriptor,
    const Descriptor* containing_descriptor) const {
  if (containing_descriptor != nullptr) {
    const std::string nested_name = ModuleLevelDescriptorName(descriptor);
    const std::string parent_name =
        ModuleLevelDescriptorName(*containing_descriptor);
    printer_->Print("$nested_name$.containing_type = $parent_name$\n",
                    "nested_name", nested_name, "parent_name", parent_name);
  }
}